

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxClassPtrCast::FxClassPtrCast(FxClassPtrCast *this,PClass *dtype,FxExpression *x)

{
  PClassPointer *pPVar1;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ClassPtrCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxClassPtrCast_00707200;
  pPVar1 = NewClassPointer(dtype);
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  this->desttype = dtype;
  this->basex = x;
  return;
}

Assistant:

FxClassPtrCast::FxClassPtrCast(PClass *dtype, FxExpression *x)
	: FxExpression(EFX_ClassPtrCast, x->ScriptPosition)
{
	ValueType = NewClassPointer(dtype);
	desttype = dtype;
	basex = x;
}